

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall slang::parsing::Lexer::tryApplyCommentHandler(Lexer *this)

{
  group_type_pointer pgVar1;
  char *pcVar2;
  byte bVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  long lVar6;
  uint uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  size_t sVar16;
  undefined1 uVar17;
  int iVar18;
  char *pcVar19;
  uint64_t uVar20;
  uint uVar21;
  byte *pbVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_class_8_1_8991fb9c nextWord;
  string_view firstWord;
  string_view local_40;
  
  pcVar19 = this->sourceBuffer;
  firstWord._M_str = pcVar19;
  while ((*firstWord._M_str == '\t' || (*firstWord._M_str == ' '))) {
    firstWord._M_str = firstWord._M_str + 1;
    this->sourceBuffer = firstWord._M_str;
    pcVar19 = pcVar19 + 1;
  }
  pbVar22 = (byte *)this->sourceBuffer;
  while( true ) {
    bVar3 = *pbVar22;
    if (((((byte)(bVar3 - 0x3a) < 0xf6) && ((byte)((bVar3 & 0xdf) + 0xa5) < 0xe6)) &&
        (bVar3 != 0x5f)) && (bVar3 != 0x2d)) break;
    this->sourceBuffer = (char *)(pbVar22 + 1);
    pbVar22 = pbVar22 + 1;
  }
  firstWord._M_len = (long)this->sourceBuffer - (long)pcVar19;
  nextWord.this = this;
  uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->options,&firstWord);
  pcVar19 = firstWord._M_str;
  sVar16 = firstWord._M_len;
  uVar24 = uVar20 >> ((byte)(this->options).commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->options).commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_;
  lVar25 = (uVar20 & 0xff) * 4;
  uVar8 = (&UNK_0047fb5c)[lVar25];
  uVar9 = (&UNK_0047fb5d)[lVar25];
  uVar10 = (&UNK_0047fb5e)[lVar25];
  uVar11 = (&UNK_0047fb5f)[lVar25];
  ppVar5 = (this->options).commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.elements_;
  uVar23 = (this->options).commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask;
  uVar27 = 0;
  do {
    pgVar1 = pgVar4 + uVar24;
    auVar30[0] = -(pgVar1->m[0].n == uVar8);
    auVar30[1] = -(pgVar1->m[1].n == uVar9);
    auVar30[2] = -(pgVar1->m[2].n == uVar10);
    auVar30[3] = -(pgVar1->m[3].n == uVar11);
    auVar30[4] = -(pgVar1->m[4].n == uVar8);
    auVar30[5] = -(pgVar1->m[5].n == uVar9);
    auVar30[6] = -(pgVar1->m[6].n == uVar10);
    auVar30[7] = -(pgVar1->m[7].n == uVar11);
    auVar30[8] = -(pgVar1->m[8].n == uVar8);
    auVar30[9] = -(pgVar1->m[9].n == uVar9);
    auVar30[10] = -(pgVar1->m[10].n == uVar10);
    auVar30[0xb] = -(pgVar1->m[0xb].n == uVar11);
    auVar30[0xc] = -(pgVar1->m[0xc].n == uVar8);
    auVar30[0xd] = -(pgVar1->m[0xd].n == uVar9);
    auVar30[0xe] = -(pgVar1->m[0xe].n == uVar10);
    auVar30[0xf] = -(pgVar1->m[0xf].n == uVar11);
    for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe); uVar21 != 0;
        uVar21 = uVar21 - 1 & uVar21) {
      iVar18 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
        }
      }
      bVar29 = sVar16 == *(size_t *)
                          ((long)&ppVar5[uVar24 * 0xf].first._M_len + (ulong)(uint)(iVar18 << 6));
      lVar25 = (long)&ppVar5[uVar24 * 0xf].first._M_len + (ulong)(uint)(iVar18 << 6);
      if (bVar29 && sVar16 != 0) {
        iVar18 = bcmp(pcVar19,*(void **)(lVar25 + 8),sVar16);
        bVar29 = iVar18 == 0;
      }
      if (bVar29) goto LAB_0014d93a;
    }
    if ((pgVar4[uVar24].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7]) == 0) break;
    lVar25 = uVar24 + uVar27;
    uVar27 = uVar27 + 1;
    uVar24 = lVar25 + 1U & uVar23;
  } while (uVar27 <= uVar23);
  lVar25 = 0;
LAB_0014d93a:
  if (lVar25 != 0) {
    local_40 = tryApplyCommentHandler::anon_class_8_1_8991fb9c::operator()(&nextWord);
    uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        (lVar25 + 0x10),&local_40);
    uVar24 = uVar20 >> (*(byte *)(lVar25 + 0x10) & 0x3f);
    lVar6 = *(long *)(lVar25 + 0x20);
    lVar26 = (uVar20 & 0xff) * 4;
    cVar12 = (&UNK_0047fb5c)[lVar26];
    cVar13 = (&UNK_0047fb5d)[lVar26];
    cVar14 = (&UNK_0047fb5e)[lVar26];
    cVar15 = (&UNK_0047fb5f)[lVar26];
    sVar16 = local_40._M_len;
    pcVar19 = local_40._M_str;
    uVar23 = 0;
    do {
      pcVar2 = (char *)(lVar6 + uVar24 * 0x10);
      auVar31[0] = -(*pcVar2 == cVar12);
      auVar31[1] = -(pcVar2[1] == cVar13);
      auVar31[2] = -(pcVar2[2] == cVar14);
      auVar31[3] = -(pcVar2[3] == cVar15);
      auVar31[4] = -(pcVar2[4] == cVar12);
      auVar31[5] = -(pcVar2[5] == cVar13);
      auVar31[6] = -(pcVar2[6] == cVar14);
      auVar31[7] = -(pcVar2[7] == cVar15);
      auVar31[8] = -(pcVar2[8] == cVar12);
      auVar31[9] = -(pcVar2[9] == cVar13);
      auVar31[10] = -(pcVar2[10] == cVar14);
      auVar31[0xb] = -(pcVar2[0xb] == cVar15);
      auVar31[0xc] = -(pcVar2[0xc] == cVar12);
      auVar31[0xd] = -(pcVar2[0xd] == cVar13);
      auVar31[0xe] = -(pcVar2[0xe] == cVar14);
      auVar31[0xf] = -(pcVar2[0xf] == cVar15);
      uVar21 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
      if (uVar21 != 0) {
        lVar26 = *(long *)(lVar25 + 0x28) + uVar24 * 600;
        do {
          uVar7 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          bVar29 = sVar16 == *(size_t *)(lVar26 + (ulong)uVar7 * 0x28);
          lVar28 = lVar26 + (ulong)uVar7 * 0x28;
          if (bVar29 && sVar16 != 0) {
            iVar18 = bcmp(pcVar19,*(void **)(lVar28 + 8),sVar16);
            bVar29 = iVar18 == 0;
          }
          if (bVar29) goto LAB_0014dabb;
          uVar21 = uVar21 - 1 & uVar21;
        } while (uVar21 != 0);
      }
      if ((*(byte *)(uVar24 * 0x10 + lVar6 + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7]) == 0) break;
      lVar26 = uVar24 + uVar23;
      uVar23 = uVar23 + 1;
      uVar24 = lVar26 + 1U & *(ulong *)(lVar25 + 0x18);
    } while (uVar23 <= *(ulong *)(lVar25 + 0x18));
    lVar28 = 0;
LAB_0014dabb:
    if (lVar28 != 0) {
      uVar17 = (*(code *)(&DAT_004b2e30 +
                         *(int *)(&DAT_004b2e30 + (ulong)*(uint *)(lVar28 + 0x10) * 4)))();
      return (bool)uVar17;
    }
  }
  return false;
}

Assistant:

bool Lexer::tryApplyCommentHandler() {
    auto nextWord = [&]() {
        // Skip over leading spaces and tabs.
        while (isTabOrSpace(peek()))
            advance();

        auto start = sourceBuffer;
        while (true) {
            char c = peek();
            if (!isAlphaNumeric(c) && c != '_' && c != '-')
                break;

            advance();
        }

        return std::string_view(start, size_t(sourceBuffer - start));
    };

    auto firstWord = nextWord();
    auto it = options.commentHandlers.find(firstWord);
    if (it == options.commentHandlers.end()) [[likely]]
        return false;

    auto it2 = it->second.find(nextWord());
    if (it2 == it->second.end())
        return false;

    auto loc = [&] { return SourceLocation(bufferId, currentOffset()); };

    auto& handler = it2->second;
    switch (handler.kind) {
        case CommentHandler::Protect:
            // We need to see begin_protected, otherwise we ignore.
            if (nextWord() == "begin_protected"sv) {
                addDiag(diag::ProtectedEnvelope, currentOffset() - lexemeLength());
                scanDisabledRegion(firstWord, "protect", "end_protected", diag::RawProtectEOF);
                return true;
            }
            return false;
        case CommentHandler::TranslateOff:
            scanDisabledRegion(firstWord, handler.endRegion, std::nullopt,
                               diag::UnclosedTranslateOff);
            return true;
        case CommentHandler::LintOff:
            sourceManager.addDiagnosticDirective(loc(), nextWord(), DiagnosticSeverity::Ignored);
            return false;
        case CommentHandler::LintOn:
            sourceManager.addDiagnosticDirective(loc(), nextWord(), DiagnosticSeverity::Warning);
            return false;
        case CommentHandler::LintSave:
            sourceManager.addDiagnosticDirective(loc(), "__push__", DiagnosticSeverity::Ignored);
            return false;
        case CommentHandler::LintRestore:
            sourceManager.addDiagnosticDirective(loc(), "__pop__", DiagnosticSeverity::Ignored);
            return false;
    }
    SLANG_UNREACHABLE;
}